

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_list3(lyd_node *parent,lys_module *module,char *name,char **key_values,
                    uint32_t *value_lengths,uint32_t options,lyd_node **node)

{
  ly_ctx *plVar1;
  lyd_node *parent_00;
  LY_ERR LVar2;
  uint uVar3;
  lys_module *plVar4;
  lysc_node **pplVar5;
  lysc_node *plVar6;
  char *pcVar8;
  ly_ctx *ctx;
  ulong uVar9;
  LY_VALUE_FORMAT format;
  lyd_node *ret;
  char **local_48;
  uint32_t *local_40;
  lyd_node *key;
  size_t sVar7;
  
  ret = (lyd_node *)0x0;
  if (parent == (lyd_node *)0x0) {
    plVar4 = module;
    if (module != (lys_module *)0x0) goto LAB_0012c6ca;
    ctx = (ly_ctx *)0x0;
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      plVar4 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar4 = parent->schema->module;
    }
LAB_0012c6ca:
    ctx = plVar4->ctx;
  }
  local_48 = key_values;
  local_40 = value_lengths;
  LVar2 = lyd_new_val_get_format(options,&format);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (parent == (lyd_node *)0x0 && module == (lys_module *)0x0) {
    pcVar8 = "parent || module";
    goto LAB_0012c7d6;
  }
  if (parent == (lyd_node *)0x0 && node == (lyd_node **)0x0) {
    pcVar8 = "parent || node";
    goto LAB_0012c7d6;
  }
  if (name == (char *)0x0) {
    pcVar8 = "name";
    goto LAB_0012c7d6;
  }
  if (local_40 == (uint32_t *)0x0 && format == LY_VALUE_LYB) {
    pcVar8 = "(format != LY_VALUE_LYB) || value_lengths";
    goto LAB_0012c7d6;
  }
  if (parent != (lyd_node *)0x0) {
    plVar6 = parent->schema;
    if (plVar6 == (lysc_node *)0x0) {
      if (module != (lys_module *)0x0) {
        plVar1 = (ly_ctx *)parent[2].schema;
        goto joined_r0x0012c786;
      }
    }
    else if (module != (lys_module *)0x0) {
      plVar1 = plVar6->module->ctx;
joined_r0x0012c786:
      if ((plVar1 != (ly_ctx *)0x0) && (module->ctx != (ly_ctx *)0x0)) {
        if (plVar6 == (lysc_node *)0x0) {
          plVar4 = (lys_module *)&parent[2].schema;
        }
        else {
          plVar4 = plVar6->module;
        }
        if (plVar4->ctx != module->ctx) {
          if (plVar6 == (lysc_node *)0x0) {
            plVar4 = (lys_module *)&parent[2].schema;
          }
          else {
            plVar4 = plVar6->module;
          }
          ly_log(plVar4->ctx,LY_LLERR,LY_EINVAL,
                 "Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
  }
  if (((options >> 1 & 1) == 0) || ((format != LY_VALUE_LYB && (format != LY_VALUE_CANON)))) {
    LVar2 = _lyd_new_list_node(ctx,parent,module,name,options,&ret);
    parent_00 = ret;
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    plVar6 = ret->schema;
    if ((local_48 == (char **)0x0) && ((plVar6->flags & 0x200) == 0)) {
      pplVar5 = (lysc_node **)&plVar6->name;
      if (plVar6 == (lysc_node *)0x0) {
        pplVar5 = &ret[1].schema;
      }
      LVar2 = LY_EINVAL;
      ly_log(ctx,LY_LLERR,LY_EINVAL,"Missing list \"%s\" keys.",*pplVar5);
    }
    else {
      plVar6 = lysc_node_child(plVar6);
      if (plVar6 != (lysc_node *)0x0) {
        uVar9 = 0;
        do {
          if ((plVar6->flags & 0x100) == 0) break;
          pcVar8 = local_48[uVar9];
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "";
          }
          if (local_40 == (uint32_t *)0x0) {
            sVar7 = strlen(pcVar8);
            uVar3 = (uint)sVar7;
          }
          else {
            uVar3 = local_40[uVar9];
          }
          LVar2 = lyd_create_term(plVar6,pcVar8,(ulong)uVar3,'\0',(byte)(options >> 1) & 1,
                                  (ly_bool *)0x0,format,(void *)0x0,0x3f3,(ly_bool *)0x0,&key);
          if (LVar2 != LY_SUCCESS) goto LAB_0012c972;
          lyd_insert_node(parent_00,(lyd_node **)0x0,key,1);
          uVar9 = (ulong)((int)uVar9 + 1);
          plVar6 = plVar6->next;
        } while (plVar6 != (lysc_node *)0x0);
      }
      LVar2 = LY_SUCCESS;
      if (parent != (lyd_node *)0x0) {
        lyd_insert_node(parent,(lyd_node **)0x0,parent_00,0);
      }
    }
LAB_0012c972:
    if (LVar2 != LY_SUCCESS) {
      lyd_free_tree(parent_00);
      return LVar2;
    }
    if (node == (lyd_node **)0x0) {
      return LY_SUCCESS;
    }
    *node = parent_00;
    return LY_SUCCESS;
  }
  pcVar8 = "!(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB))";
LAB_0012c7d6:
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar8,"lyd_new_list3");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_list3(struct lyd_node *parent, const struct lys_module *module, const char *name, const char **key_values,
        uint32_t *value_lengths, uint32_t options, struct lyd_node **node)
{
    struct lyd_node *ret = NULL, *key;
    const struct lysc_node *key_s;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);
    const void *key_val;
    uint32_t key_len, i;
    LY_ERR rc = LY_SUCCESS;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    LY_VALUE_FORMAT format;

    LY_CHECK_RET(lyd_new_val_get_format(options, &format));
    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name, (format != LY_VALUE_LYB) || value_lengths, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);
    LY_CHECK_ARG_RET(ctx, !(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB)), LY_EINVAL);

    /* create the list node */
    LY_CHECK_RET(_lyd_new_list_node(ctx, parent, module, name, options, &ret));

    if (!(ret->schema->flags & LYS_KEYLESS) && !key_values) {
        LOGERR(ctx, LY_EINVAL, "Missing list \"%s\" keys.", LYD_NAME(ret));
        rc = LY_EINVAL;
        goto cleanup;
    }

    /* create and insert all the keys */
    i = 0;
    for (key_s = lysc_node_child(ret->schema); key_s && (key_s->flags & LYS_KEY); key_s = key_s->next) {
        key_val = key_values[i] ? key_values[i] : "";
        key_len = value_lengths ? value_lengths[i] : strlen(key_val);

        rc = lyd_create_term(key_s, key_val, key_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &key);
        LY_CHECK_GOTO(rc, cleanup);
        lyd_insert_node(ret, NULL, key, LYD_INSERT_NODE_LAST);
        ++i;
    }

    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

cleanup:
    if (rc) {
        lyd_free_tree(ret);
        ret = NULL;
    } else if (node) {
        *node = ret;
    }
    return rc;
}